

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

char * __thiscall spirv_cross::CompilerMSL::to_restrict(CompilerMSL *this,uint32_t id,bool space)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  bool bVar1;
  ID id_00;
  SPIRType *pSVar2;
  Bitset *pBVar3;
  size_type sVar4;
  char *pcVar5;
  Bitset flags;
  Bitset local_a8;
  Bitset local_68;
  
  this_00 = &local_a8.higher;
  local_a8.lower = 0;
  local_a8.higher._M_h._M_buckets = &local_a8.higher._M_h._M_single_bucket;
  local_a8.higher._M_h._M_bucket_count = 1;
  local_a8.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.higher._M_h._M_element_count = 0;
  local_a8.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.higher._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
      [id].type == TypeVariable) {
    id_00.id = Compiler::expression_type_id((Compiler *)this,id);
    pSVar2 = Compiler::expression_type((Compiler *)this,id);
    if (pSVar2->basetype == Struct) {
      bVar1 = Compiler::has_decoration((Compiler *)this,id_00,Block);
      if (!bVar1) {
        bVar1 = Compiler::has_decoration((Compiler *)this,id_00,BufferBlock);
        if (!bVar1) goto LAB_002198bd;
      }
      Compiler::get_buffer_block_flags(&local_68,(Compiler *)this,(VariableID)id);
      local_a8.lower = CONCAT44(local_68.lower._4_4_,(undefined4)local_68.lower);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&this_00->_M_h,&local_68.higher);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68.higher._M_h);
    }
    else {
LAB_002198bd:
      pBVar3 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
      local_a8.lower = pBVar3->lower;
      if (pBVar3 != &local_a8) {
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,&(pBVar3->higher)._M_h);
      }
    }
  }
  else {
    pBVar3 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    local_a8.lower = pBVar3->lower;
    if (pBVar3 != &local_a8) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&(pBVar3->higher)._M_h);
    }
  }
  if ((local_a8.lower & 0x80000) == 0) {
    local_68.lower._0_4_ = 0x14eb;
    sVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,(key_type *)&local_68);
    if (sVar4 == 0) {
      pcVar5 = "";
      goto LAB_00219919;
    }
  }
  pcVar5 = "__restrict";
  if (space) {
    pcVar5 = "__restrict ";
  }
LAB_00219919:
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  return pcVar5;
}

Assistant:

const char *CompilerMSL::to_restrict(uint32_t id, bool space)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	if (ir.ids[id].get_type() == TypeVariable)
	{
		uint32_t type_id = expression_type_id(id);
		auto &type = expression_type(id);
		if (type.basetype == SPIRType::Struct &&
		    (has_decoration(type_id, DecorationBlock) || has_decoration(type_id, DecorationBufferBlock)))
			flags = get_buffer_block_flags(id);
		else
			flags = get_decoration_bitset(id);
	}
	else
		flags = get_decoration_bitset(id);

	return flags.get(DecorationRestrict) || flags.get(DecorationRestrictPointerEXT) ?
	       (space ? "__restrict " : "__restrict") : "";
}